

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

void __thiscall
particleSamples::perform_resonance_feed_down
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *input_particle_list)

{
  particle_info part;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  size_type sVar14;
  reference pvVar15;
  reference paVar16;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_RSI;
  vector<particle_info,_std::allocator<particle_info>_> *in_stack_00000110;
  particle_info *in_stack_00000118;
  particle_decay *in_stack_00000120;
  anon_struct_120_15_f999644b *daughter_i;
  iterator __end3;
  iterator __begin3;
  vector<particle_info,_std::allocator<particle_info>_> *__range3;
  vector<particle_info,_std::allocator<particle_info>_> daughter_list;
  value_type part_i_1;
  anon_struct_120_15_f999644b *part_i;
  iterator __end2;
  iterator __begin2;
  vector<particle_info,_std::allocator<particle_info>_> *__range2;
  list<particle_info,_std::allocator<particle_info>_> current_ev_list;
  vector<particle_info,_std::allocator<particle_info>_> **ev_i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *__range1;
  int ievent;
  vector<particle_info,_std::allocator<particle_info>_> *in_stack_fffffffffffffd78;
  particle_decay *in_stack_fffffffffffffd80;
  value_type *in_stack_fffffffffffffd88;
  list<particle_info,_std::allocator<particle_info>_> *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffdd8;
  pretty_ostream *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
  local_140;
  undefined1 *local_138;
  undefined1 local_130 [24];
  undefined8 local_118;
  double dStack_110;
  undefined8 local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  reference local_a0;
  anon_struct_120_15_f999644b *local_98;
  __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
  local_90;
  vector<particle_info,_std::allocator<particle_info>_> *local_88;
  reference local_68;
  vector<particle_info,_std::allocator<particle_info>_> **local_60;
  __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
  local_58;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *local_50;
  int local_48;
  allocator local_31;
  string local_30 [32];
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"perform resonance decays... ",&local_31);
  pretty_ostream::info(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_48 = 0;
  local_50 = local_10;
  local_58._M_current =
       (vector<particle_info,_std::allocator<particle_info>_> **)
       std::
       vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
       ::begin((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                *)in_stack_fffffffffffffd78);
  local_60 = (vector<particle_info,_std::allocator<particle_info>_> **)
             std::
             vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             ::end((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    *)in_stack_fffffffffffffd78);
  while( true ) {
    bVar13 = __gnu_cxx::operator!=
                       ((__normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
                         *)in_stack_fffffffffffffd80,
                        (__normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
                         *)in_stack_fffffffffffffd78);
    if (!bVar13) break;
    local_68 = __gnu_cxx::
               __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
               ::operator*(&local_58);
    std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::list
              ((list<particle_info,_std::allocator<particle_info>_> *)0x14912c);
    local_88 = *local_68;
    local_90._M_current =
         (anon_struct_120_15_f999644b *)
         std::vector<particle_info,_std::allocator<particle_info>_>::begin
                   (in_stack_fffffffffffffd78);
    local_98 = (anon_struct_120_15_f999644b *)
               std::vector<particle_info,_std::allocator<particle_info>_>::end
                         (in_stack_fffffffffffffd78);
    while( true ) {
      bVar13 = __gnu_cxx::operator!=
                         ((__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                           *)in_stack_fffffffffffffd80,
                          (__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                           *)in_stack_fffffffffffffd78);
      if (!bVar13) break;
      local_a0 = __gnu_cxx::
                 __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                 ::operator*(&local_90);
      std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::push_back
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      __gnu_cxx::
      __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
      ::operator++(&local_90);
    }
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::operator[](local_10,(long)local_48);
    std::vector<particle_info,_std::allocator<particle_info>_>::clear
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x149243);
    while( true ) {
      sVar14 = std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::size
                         ((list<particle_info,_std::allocator<particle_info>_> *)
                          in_stack_fffffffffffffd80);
      if (sVar14 == 0) break;
      pvVar15 = std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::front
                          ((list<particle_info,_std::allocator<particle_info>_> *)
                           in_stack_fffffffffffffd80);
      local_a8 = pvVar15->phi_p;
      local_b8 = pvVar15->rap_eta;
      dStack_b0 = pvVar15->pT;
      local_c8 = pvVar15->t;
      dStack_c0 = pvVar15->rap_y;
      local_d8 = pvVar15->y;
      dStack_d0 = pvVar15->z;
      local_118 = *(undefined8 *)pvVar15;
      dStack_110 = pvVar15->mass;
      local_108 = *(undefined8 *)&pvVar15->baryon;
      dStack_100 = pvVar15->px;
      local_f8 = pvVar15->py;
      dStack_f0 = pvVar15->pz;
      local_e8 = pvVar15->E;
      dStack_e0 = pvVar15->x;
      std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::pop_front
                ((list<particle_info,_std::allocator<particle_info>_> *)in_stack_fffffffffffffd80);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x1492f8);
      particle_decay::perform_decays(in_stack_00000120,in_stack_00000118,in_stack_00000110);
      local_138 = local_130;
      local_140._M_current =
           (anon_struct_120_15_f999644b *)
           std::vector<particle_info,_std::allocator<particle_info>_>::begin
                     (in_stack_fffffffffffffd78);
      std::vector<particle_info,_std::allocator<particle_info>_>::end(in_stack_fffffffffffffd78);
      while( true ) {
        bVar13 = __gnu_cxx::operator!=
                           ((__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                             *)in_stack_fffffffffffffd80,
                            (__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                             *)in_stack_fffffffffffffd78);
        if (!bVar13) break;
        paVar16 = __gnu_cxx::
                  __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                  ::operator*(&local_140);
        in_stack_fffffffffffffd78 =
             *(vector<particle_info,_std::allocator<particle_info>_> **)paVar16;
        in_stack_fffffffffffffd80 = (particle_decay *)paVar16->mass;
        in_stack_fffffffffffffd88 = *(value_type **)&paVar16->baryon;
        in_stack_fffffffffffffd90 =
             (list<particle_info,_std::allocator<particle_info>_> *)paVar16->px;
        uVar1 = paVar16->px;
        uVar2 = paVar16->py;
        uVar3 = paVar16->pz;
        uVar4 = paVar16->E;
        uVar5 = paVar16->x;
        uVar6 = paVar16->y;
        uVar7 = paVar16->z;
        uVar8 = paVar16->t;
        uVar9 = paVar16->rap_y;
        uVar10 = paVar16->rap_eta;
        uVar11 = paVar16->pT;
        uVar12 = paVar16->phi_p;
        part.rap_y = (double)uVar12;
        part.t = (double)uVar11;
        part.z = (double)uVar10;
        part.y = (double)uVar9;
        part.x = (double)uVar8;
        part.E = (double)uVar7;
        part.pz = (double)uVar6;
        part.py = (double)uVar5;
        part.px = (double)uVar4;
        part._16_8_ = uVar3;
        part.mass = (double)uVar2;
        part._0_8_ = uVar1;
        part.rap_eta = (double)paVar16;
        part.pT = (double)&stack0xfffffffffffffd78;
        part.phi_p._0_4_ = in_stack_fffffffffffffe00;
        part.phi_p._4_4_ = in_stack_fffffffffffffe04;
        in_stack_fffffffffffffe04 =
             particle_decay::check_particle_stable(in_stack_fffffffffffffd80,part);
        if (in_stack_fffffffffffffe04 == 1) {
          std::
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          ::operator[](local_10,(long)local_48);
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((vector<particle_info,_std::allocator<particle_info>_> *)
                     in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        }
        else {
          std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::push_back
                    (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        }
        __gnu_cxx::
        __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
        ::operator++(&local_140);
      }
      std::vector<particle_info,_std::allocator<particle_info>_>::clear
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x149516);
      std::vector<particle_info,_std::allocator<particle_info>_>::~vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)in_stack_fffffffffffffd90)
      ;
    }
    std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::clear
              ((list<particle_info,_std::allocator<particle_info>_> *)in_stack_fffffffffffffd80);
    local_48 = local_48 + 1;
    std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::~list
              ((list<particle_info,_std::allocator<particle_info>_> *)0x149553);
    __gnu_cxx::
    __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
    ::operator++(&local_58);
  }
  return;
}

Assistant:

void particleSamples::perform_resonance_feed_down(
    vector<vector<particle_info> *> *input_particle_list) {
    messager.info("perform resonance decays... ");
    // loop over events
    int ievent = 0;
    for (auto &ev_i : (*input_particle_list)) {
        // create a temporary particle list
        std::list<particle_info> current_ev_list;

        // copy all particles into the temp list
        for (auto &part_i : (*ev_i)) {
            current_ev_list.push_back(part_i);
        }

        (*input_particle_list)[ievent]->clear();

        // perform resonance decays
        while (current_ev_list.size() > 0) {
            auto part_i = current_ev_list.front();
            current_ev_list.pop_front();
            vector<particle_info> daughter_list;
            decayer_ptr->perform_decays(part_i, daughter_list);
            for (auto &daughter_i : daughter_list) {
                if (decayer_ptr->check_particle_stable(daughter_i) == 1) {
                    (*input_particle_list)[ievent]->push_back(daughter_i);
                } else {
                    current_ev_list.push_back(daughter_i);
                }
            }
            daughter_list.clear();
        }
        current_ev_list.clear();
        ievent++;
    }
}